

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

uint dxil_spv::get_geometry_shader_stream_index(MDNode *node)

{
  uint uVar1;
  MetadataKind MVar2;
  uint uVar3;
  MDOperand *pMVar4;
  MDNode *this;
  uint index;
  
  uVar1 = LLVMBC::MDNode::getNumOperands(node);
  if ((10 < uVar1) && (pMVar4 = LLVMBC::MDNode::getOperand(node,10), pMVar4->kind != None)) {
    this = (MDNode *)LLVMBC::MDNode::getOperand(node,10);
    MVar2 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)this);
    if ((MVar2 == Node) && (uVar1 = LLVMBC::MDNode::getNumOperands(this), 1 < uVar1)) {
      uVar1 = uVar1 >> 1;
      index = 1;
      do {
        uVar3 = get_constant_metadata<unsigned_int>(this,index - 1);
        if (uVar3 == 0) {
          uVar1 = get_constant_metadata<unsigned_int>(this,index);
          return uVar1;
        }
        index = index + 2;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
  }
  return 0;
}

Assistant:

static unsigned get_geometry_shader_stream_index(const llvm::MDNode *node)
{
	if (node->getNumOperands() >= 11 && node->getOperand(10))
	{
		auto *attr = llvm::dyn_cast<llvm::MDNode>(node->getOperand(10));
		if (!attr)
			return 0;

		unsigned num_pairs = attr->getNumOperands() / 2;
		for (unsigned i = 0; i < num_pairs; i++)
		{
			if (static_cast<DXIL::GSStageOutTags>(get_constant_metadata(attr, 2 * i + 0)) == DXIL::GSStageOutTags::Stream)
				return get_constant_metadata(attr, 2 * i + 1);
		}
	}
	return 0;
}